

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

void __thiscall capnp::compiler::Compiler::Node::Node(Node *this,CompiledModule *module)

{
  _Rb_tree_header *p_Var1;
  uint uVar2;
  void *pvVar3;
  int iVar4;
  uint32_t uVar5;
  uint64_t uVar6;
  undefined4 extraout_var;
  size_t extraout_RDX;
  WirePointer *pWVar7;
  bool bVar8;
  StringPtr declName;
  Reader RVar9;
  Reader name;
  ListReader local_88;
  PointerReader local_58;
  
  (this->super_Resolver)._vptr_Resolver = (_func_int **)&PTR_resolve_0020e780;
  this->module = module;
  pWVar7 = (WirePointer *)0x0;
  (this->parent).ptr = (Node *)0x0;
  capnp::_::OrphanBuilder::asStructReader
            ((StructReader *)&local_88,&(module->content).builder,(StructSize)0x10000);
  bVar8 = local_88.structPointerCount == 0;
  local_58.pointer = (WirePointer *)CONCAT44(local_88.step,local_88.elementCount);
  if (bVar8) {
    local_58.pointer = pWVar7;
  }
  local_58.nestingLimit = local_88.nestingLimit;
  if (bVar8) {
    local_58.nestingLimit = 0x7fffffff;
  }
  local_58.segment._0_4_ = 0;
  local_58.segment._4_4_ = 0;
  local_58.capTable._0_4_ = 0;
  local_58.capTable._4_4_ = 0;
  if (!bVar8) {
    local_58.segment._0_4_ = local_88.segment._0_4_;
    local_58.segment._4_4_ = local_88.segment._4_4_;
    local_58.capTable._0_4_ = local_88.capTable._0_4_;
    local_58.capTable._4_4_ = local_88.capTable._4_4_;
  }
  capnp::_::PointerReader::getStruct(&(this->declaration)._reader,&local_58,(word *)0x0);
  bVar8 = (this->declaration)._reader.pointerCount != 0;
  local_58.pointer = (WirePointer *)0x0;
  local_58.nestingLimit = 0x7fffffff;
  if (bVar8) {
    local_58.pointer = (this->declaration)._reader.pointers;
    local_58.nestingLimit = (this->declaration)._reader.nestingLimit;
  }
  local_58.segment._0_4_ = 0;
  local_58.segment._4_4_ = 0;
  local_58.capTable._0_4_ = 0;
  local_58.capTable._4_4_ = 0;
  if (bVar8) {
    local_58.segment._0_4_ = *(undefined4 *)&(this->declaration)._reader.segment;
    local_58.segment._4_4_ = *(undefined4 *)((long)&(this->declaration)._reader.segment + 4);
    local_58.capTable._0_4_ = *(undefined4 *)&(this->declaration)._reader.capTable;
    local_58.capTable._4_4_ = *(undefined4 *)((long)&(this->declaration)._reader.capTable + 4);
  }
  capnp::_::PointerReader::getStruct((StructReader *)&local_88,&local_58,(word *)0x0);
  local_58.pointer = (WirePointer *)0x0;
  local_58.nestingLimit = 0x7fffffff;
  if (local_88.structPointerCount != 0) {
    local_58.pointer = (WirePointer *)CONCAT44(local_88.step,local_88.elementCount);
    local_58.nestingLimit = local_88.nestingLimit;
  }
  local_58.segment._0_4_ = 0;
  local_58.segment._4_4_ = 0;
  local_58.capTable._0_4_ = 0;
  local_58.capTable._4_4_ = 0;
  if (local_88.structPointerCount != 0) {
    local_58.segment._0_4_ = local_88.segment._0_4_;
    local_58.segment._4_4_ = local_88.segment._4_4_;
    local_58.capTable._0_4_ = local_88.capTable._0_4_;
    local_58.capTable._4_4_ = local_88.capTable._4_4_;
  }
  declName.content =
       (ArrayPtr<const_char>)capnp::_::PointerReader::getBlob<capnp::Text>(&local_58,(void *)0x0,0);
  uVar6 = generateId(0,declName,(Reader)(this->declaration)._reader);
  this->id = uVar6;
  iVar4 = (*(module->parserModule->super_ErrorReporter)._vptr_ErrorReporter[3])();
  (this->displayName).content.ptr = (char *)CONCAT44(extraout_var,iVar4);
  (this->displayName).content.size_ = extraout_RDX;
  if (0x1f < (this->declaration)._reader.dataSize) {
    pWVar7 = (WirePointer *)(ulong)*(ushort *)((long)(this->declaration)._reader.data + 2);
  }
  this->kind = (Which)pWVar7;
  bVar8 = (this->declaration)._reader.pointerCount < 8;
  local_58.pointer = (this->declaration)._reader.pointers + 7;
  if (bVar8) {
    local_58.pointer = (WirePointer *)0x0;
  }
  iVar4 = 0x7fffffff;
  local_58.nestingLimit = (this->declaration)._reader.nestingLimit;
  if (bVar8) {
    local_58.nestingLimit = 0x7fffffff;
    local_58.segment._0_4_ = 0;
    local_58.segment._4_4_ = 0;
    local_58.capTable._0_4_ = 0;
    local_58.capTable._4_4_ = 0;
  }
  else {
    local_58.segment._0_4_ = *(undefined4 *)&(this->declaration)._reader.segment;
    local_58.segment._4_4_ = *(undefined4 *)((long)&(this->declaration)._reader.segment + 4);
    local_58.capTable._0_4_ = *(undefined4 *)&(this->declaration)._reader.capTable;
    local_58.capTable._4_4_ = *(undefined4 *)((long)&(this->declaration)._reader.capTable + 4);
  }
  capnp::_::PointerReader::getList(&local_88,&local_58,INLINE_COMPOSITE,(word *)0x0);
  this->genericParamCount = local_88.elementCount;
  this->isBuiltin = false;
  (this->guardedContent).state = STUB;
  p_Var1 = &(this->guardedContent).nestedNodes._M_t._M_impl.super__Rb_tree_header;
  (this->guardedContent).nestedNodes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->guardedContent).nestedNodes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->guardedContent).nestedNodes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->guardedContent).nestedNodes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  local_58.segment._0_4_ = 0;
  local_58.segment._4_4_ = 0;
  local_58.capTable._0_4_ = 0;
  local_58.capTable._4_4_ = 0;
  (this->guardedContent).nestedNodes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->guardedContent).orderedNestedNodes.builder.ptr = (Node **)0x0;
  (this->guardedContent).orderedNestedNodes.builder.pos =
       (RemoveConst<capnp::compiler::Compiler::Node_*> *)0x0;
  (this->guardedContent).orderedNestedNodes.builder.endPtr = (Node **)0x0;
  (this->guardedContent).orderedNestedNodes.builder.disposer =
       (ArrayDisposer *)&kj::NullArrayDisposer::instance;
  p_Var1 = &(this->guardedContent).aliases._M_t._M_impl.super__Rb_tree_header;
  (this->guardedContent).aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->guardedContent).aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->guardedContent).aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->guardedContent).aliases._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->guardedContent).aliases._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->guardedContent).bootstrapSchema.ptr.isSet = false;
  (this->guardedContent).finalSchema.ptr.isSet = false;
  (this->loadedFinalSchema).ptr.isSet = false;
  (this->guardedContent).auxSchemas.ptr = (Reader *)0x0;
  (this->guardedContent).auxSchemas.size_ = 0;
  (this->guardedContent).auxSchemas.disposer = (ArrayDisposer *)0x0;
  (this->guardedContent).sourceInfo.ptr = (Reader *)0x0;
  (this->guardedContent).sourceInfo.size_ = 0;
  (this->guardedContent).sourceInfo.disposer = (ArrayDisposer *)0x0;
  this->inGetContent = false;
  local_58.pointer = (WirePointer *)0x0;
  if ((this->declaration)._reader.pointerCount != 0) {
    local_58.pointer = (this->declaration)._reader.pointers;
    iVar4 = (this->declaration)._reader.nestingLimit;
    local_58.segment._0_4_ = *(undefined4 *)&(this->declaration)._reader.segment;
    local_58.segment._4_4_ = *(undefined4 *)((long)&(this->declaration)._reader.segment + 4);
    local_58.capTable._0_4_ = *(undefined4 *)&(this->declaration)._reader.capTable;
    local_58.capTable._4_4_ = *(undefined4 *)((long)&(this->declaration)._reader.capTable + 4);
  }
  local_58.nestingLimit = iVar4;
  capnp::_::PointerReader::getStruct((StructReader *)&local_88,&local_58,(word *)0x0);
  bVar8 = local_88.structPointerCount == 0;
  local_58.pointer = (WirePointer *)CONCAT44(local_88.step,local_88.elementCount);
  if (bVar8) {
    local_58.pointer = (WirePointer *)0x0;
  }
  local_58.nestingLimit = 0x7fffffff;
  if (!bVar8) {
    local_58.nestingLimit = local_88.nestingLimit;
  }
  local_58.segment._0_4_ = 0;
  local_58.segment._4_4_ = 0;
  local_58.capTable._0_4_ = 0;
  local_58.capTable._4_4_ = 0;
  if (!bVar8) {
    local_58.segment._0_4_ = local_88.segment._0_4_;
    local_58.segment._4_4_ = local_88.segment._4_4_;
    local_58.capTable._0_4_ = local_88.capTable._0_4_;
    local_58.capTable._4_4_ = local_88.capTable._4_4_;
  }
  RVar9 = capnp::_::PointerReader::getBlob<capnp::Text>(&local_58,(void *)0x0,0);
  if (RVar9.super_StringPtr.content.size_ == 1) {
    uVar2 = (this->declaration)._reader.dataSize;
    if (uVar2 < 0x40) {
LAB_00115de3:
      this->startByte = 0;
    }
    else {
      pvVar3 = (this->declaration)._reader.data;
      this->startByte = *(uint32_t *)((long)pvVar3 + 4);
      if (0x5f < uVar2) {
        uVar5 = *(uint32_t *)((long)pvVar3 + 8);
        goto LAB_00115dec;
      }
    }
  }
  else {
    if (local_88.structDataSize < 0x20) goto LAB_00115de3;
    this->startByte = *(uint32_t *)local_88.ptr;
    if (0x3f < local_88.structDataSize) {
      uVar5 = *(uint32_t *)((long)local_88.ptr + 4);
      goto LAB_00115dec;
    }
  }
  uVar5 = 0;
LAB_00115dec:
  this->endByte = uVar5;
  uVar6 = Impl::addNode(module->compiler,this->id,this);
  this->id = uVar6;
  return;
}

Assistant:

Compiler::Node::Node(CompiledModule& module)
    : module(&module),
      parent(kj::none),
      declaration(module.getParsedFile().getRoot()),
      id(generateId(0, declaration.getName().getValue(), declaration.getId())),
      displayName(module.getSourceName()),
      kind(declaration.which()),
      genericParamCount(declaration.getParameters().size()),
      isBuiltin(false) {
  auto name = declaration.getName();
  if (name.getValue().size() > 0) {
    startByte = name.getStartByte();
    endByte = name.getEndByte();
  } else {
    startByte = declaration.getStartByte();
    endByte = declaration.getEndByte();
  }

  id = module.getCompiler().addNode(id, *this);
}